

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> * __thiscall
kj::_::ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
operator=(ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *this,
         ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
         *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::operator=
            (&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;